

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

void __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_false>::eval_divide_by_single_limb
          (uintwide_t<256U,_unsigned_int,_void,_false> *this,limb_type short_denominator,
          unsigned_fast_type u_offset,uintwide_t<256U,_unsigned_int,_void,_false> *remainder)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  long lVar5;
  
  if (u_offset << 0x20 == 0x800000000) {
    uVar4 = 0;
    iVar2 = 0;
  }
  else {
    lVar5 = (long)(0x800000000 - (u_offset << 0x20)) >> 0x1e;
    uVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = CONCAT44((int)uVar4 - (int)uVar3 * short_denominator,
                       *(undefined4 *)
                        ((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar5 + -4));
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar4;
      uVar3 = SUB168(auVar1 / ZEXT416(short_denominator),0);
      iVar2 = SUB164(auVar1 / ZEXT416(short_denominator),0);
      *(int *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar5 + -4) = iVar2;
      lVar5 = lVar5 + -4;
    } while (lVar5 != 0);
  }
  if (remainder != (uintwide_t<256U,_unsigned_int,_void,_false> *)0x0) {
    (remainder->values).super_array<unsigned_int,_8UL>.elems[0] =
         (int)uVar4 - iVar2 * short_denominator;
    (remainder->values).super_array<unsigned_int,_8UL>.elems[1] = 0;
    (remainder->values).super_array<unsigned_int,_8UL>.elems[2] = 0;
    (remainder->values).super_array<unsigned_int,_8UL>.elems[3] = 0;
    (remainder->values).super_array<unsigned_int,_8UL>.elems[4] = 0;
    (remainder->values).super_array<unsigned_int,_8UL>.elems[4] = 0;
    (remainder->values).super_array<unsigned_int,_8UL>.elems[5] = 0;
    (remainder->values).super_array<unsigned_int,_8UL>.elems[6] = 0;
    (remainder->values).super_array<unsigned_int,_8UL>.elems[7] = 0;
  }
  return;
}

Assistant:

constexpr auto eval_divide_by_single_limb(const limb_type          short_denominator,
                                              const unsigned_fast_type u_offset,
                                                    uintwide_t*        remainder) -> void
    {
      // The denominator has one single limb.
      // Use a one-dimensional division algorithm.

      auto long_numerator = double_limb_type { };
      auto hi_part        = static_cast<limb_type>(UINT8_C(0));

      {
        reverse_iterator
          ri
          {
            detail::advance_and_point
            (
              values.begin(),
              static_cast<size_t>(number_of_limbs - static_cast<size_t>(u_offset))
            )
          };

        for( ; ri != values.rend(); ++ri) // NOLINT(altera-id-dependent-backward-branch)
        {
          long_numerator =
            static_cast<double_limb_type>
            (
               *ri
             + static_cast<double_limb_type>
               (
                    static_cast<double_limb_type>
                    (
                        long_numerator
                      - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                    )
                 << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
               )
            );

          *ri = detail::make_lo<limb_type>(static_cast<double_limb_type>(long_numerator / short_denominator));

          hi_part = *ri;
        }
      }

      if(remainder != nullptr)
      {
        long_numerator =
          static_cast<double_limb_type>
          (
             static_cast<double_limb_type>(*values.cbegin())
           + static_cast<double_limb_type>
             (
                  static_cast<double_limb_type>
                  (
                    long_numerator - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                  )
               << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
             )
          );

        *remainder =
          static_cast<limb_type>
          (
            long_numerator >> static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
          );
      }
    }